

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::javanano::RepeatedPrimitiveFieldGenerator::GenerateSerializedSizeCode
          (RepeatedPrimitiveFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  Type TVar2;
  JavaType type;
  char *text;
  
  io::Printer::Print(printer,&this->variables_,
                     "if (this.$name$ != null && this.$name$.length > 0) {\n");
  io::Printer::Indent(printer);
  GenerateRepeatedDataSizeCode(this,printer);
  io::Printer::Print(printer,"size += dataSize;\n");
  if (*(int *)(this->descriptor_ + 0x4c) == 3) {
    TVar2 = FieldDescriptor::type(this->descriptor_);
    if ((TVar2 - TYPE_UINT32 < 0xfffffffc) &&
       (*(char *)(*(long *)(this->descriptor_ + 0x80) + 0x6c) != '\0')) {
      text = 
      "size += $tag_size$;\nsize += com.google.protobuf.nano.CodedOutputByteBufferNano\n    .computeRawVarint32Size(dataSize);\n"
      ;
      goto LAB_002af175;
    }
  }
  TVar2 = FieldDescriptor::type(this->descriptor_);
  type = GetJavaType(TVar2);
  bVar1 = anon_unknown_5::IsReferenceType(type);
  text = "size += $tag_size$ * this.$name$.length;\n";
  if (bVar1) {
    text = "size += $tag_size$ * dataCount;\n";
  }
LAB_002af175:
  io::Printer::Print(printer,&this->variables_,text);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void RepeatedPrimitiveFieldGenerator::
GenerateSerializedSizeCode(io::Printer* printer) const {
  printer->Print(variables_,
    "if (this.$name$ != null && this.$name$.length > 0) {\n");
  printer->Indent();

  GenerateRepeatedDataSizeCode(printer);

  printer->Print(
    "size += dataSize;\n");
  if (descriptor_->is_packable() && descriptor_->options().packed()) {
    printer->Print(variables_,
      "size += $tag_size$;\n"
      "size += com.google.protobuf.nano.CodedOutputByteBufferNano\n"
      "    .computeRawVarint32Size(dataSize);\n");
  } else if (IsReferenceType(GetJavaType(descriptor_))) {
    printer->Print(variables_,
      "size += $tag_size$ * dataCount;\n");
  } else {
    printer->Print(variables_,
      "size += $tag_size$ * this.$name$.length;\n");
  }

  printer->Outdent();

  printer->Print(
    "}\n");
}